

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O0

int archive_compressor_bzip2_write(archive_write_filter *f,void *buff,size_t length)

{
  private_data_conflict3 *data_00;
  int iVar1;
  private_data_conflict3 *data;
  size_t length_local;
  void *buff_local;
  archive_write_filter *f_local;
  
  data_00 = (private_data_conflict3 *)f->data;
  data_00->total_in = length + data_00->total_in;
  (data_00->stream).next_in = (char *)buff;
  (data_00->stream).avail_in = (uint)length;
  iVar1 = drive_compressor(f,data_00,0);
  if (iVar1 == 0) {
    f_local._4_4_ = 0;
  }
  else {
    f_local._4_4_ = -0x1e;
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_bzip2_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *data = (struct private_data *)f->data;

	/* Update statistics */
	data->total_in += length;

	/* Compress input data to output buffer */
	SET_NEXT_IN(data, buff);
	data->stream.avail_in = length;
	if (drive_compressor(f, data, 0))
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}